

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O0

void __thiscall Conversion::Conversion(Conversion *this,string *vocab)

{
  string local_38 [32];
  string *local_18;
  string *vocab_local;
  Conversion *this_local;
  
  local_18 = vocab;
  vocab_local = &this->indexToChar;
  std::__cxx11::string::string((string *)this);
  std::map<char,_long_long,_std::less<char>,_std::allocator<std::pair<const_char,_long_long>_>_>::
  map(&this->charToIndex);
  std::__cxx11::string::string(local_38,(string *)vocab);
  setVocab(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Conversion::Conversion(string vocab) {
    setVocab(std::move(vocab));
}